

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BorderAmounts::BorderAmounts(BorderAmounts *this,BorderAmounts *from)

{
  BorderAmounts *from_local;
  BorderAmounts *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__BorderAmounts_006f3848;
  google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::
  RepeatedPtrField(&this->borderamounts_,&from->borderamounts_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

BorderAmounts::BorderAmounts(const BorderAmounts& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      borderamounts_(from.borderamounts_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BorderAmounts)
}